

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functions.cpp
# Opt level: O3

DHT_action DHT_Request(DHT_action akv)

{
  endpoint *peVar1;
  addressInfo server;
  _func_int ***ppp_Var2;
  ulong uVar3;
  ostream *poVar4;
  ulong uVar5;
  service *psVar6;
  type *ptVar7;
  ulong uVar8;
  execution_context eVar9;
  DHT_action DVar10;
  DHT_action DVar11;
  DHT_action action;
  DHT_action action_00;
  DHT_action action_01;
  string __str;
  array<unsigned_char,_18UL> return_tracker_message;
  io_context io_context;
  array<unsigned_char,_4UL> key_message;
  results_type endpoints;
  socket socket;
  error_code error;
  resolver resolver;
  data_union local_188;
  int local_168;
  int local_164;
  ulong local_160;
  ulong local_158;
  undefined1 local_150 [32];
  addressInfo local_130;
  undefined2 uStack_12a;
  undefined4 uStack_128;
  undefined8 local_124;
  io_context local_118;
  undefined8 local_108;
  ulong local_100;
  int local_f4;
  undefined1 local_f0 [24];
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  local_d8;
  error_code local_88;
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  local_78;
  
  asio::io_context::io_context(&local_118);
  asio::detail::
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<asio::io_context>(&local_78,&local_118,(type *)0x0);
  ip_tostr_abi_cxx11_((string *)&local_d8,(array<unsigned_char,_4UL>)0x100007f);
  local_188._0_8_ = (char *)((long)&local_188 + 0x10U);
  std::__cxx11::string::_M_construct((ulong)&local_188,'\x04');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_188._0_8_,4,3000);
  ptVar7 = (type *)0x0;
  asio::ip::
  basic_resolver<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::resolve((results_type *)local_f0,
            (basic_resolver<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
             *)&local_78,(string *)&local_d8,(string *)&local_188,0);
  if ((char *)local_188._0_8_ != (char *)((long)&local_188 + 0x10U)) {
    operator_delete((void *)local_188._0_8_);
  }
  if (local_d8.service_ !=
      (service_type *)&local_d8.implementation_.super_base_implementation_type.reactor_data_) {
    operator_delete(local_d8.service_);
  }
  local_188._0_8_ =
       &asio::detail::typeid_wrapper<asio::detail::reactive_socket_service<asio::ip::tcp>>::typeinfo
  ;
  local_188.base.sa_data[6] = '\0';
  local_188.base.sa_data[7] = '\0';
  local_188.base.sa_data[8] = '\0';
  local_188.base.sa_data[9] = '\0';
  local_188.base.sa_data[10] = '\0';
  local_188.base.sa_data[0xb] = '\0';
  local_188.base.sa_data[0xc] = '\0';
  local_188.base.sa_data[0xd] = '\0';
  local_d8.service_ =
       (service_type *)
       asio::detail::service_registry::do_use_service
                 (local_118.super_execution_context.service_registry_,(key *)&local_188,
                  asio::detail::service_registry::
                  create<asio::detail::reactive_socket_service<asio::ip::tcp>,asio::io_context>,
                  &local_118);
  local_d8.executor_.super_any_executor_base.target_ = &local_d8.executor_;
  local_d8.implementation_.protocol_.family_ = 2;
  local_d8.executor_.super_any_executor_base.target_fns_ =
       (target_fns *)
       asio::execution::detail::any_executor_base::
       target_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>(bool,std::enable_if<!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value,void>::type*)
       ::fns_with_execute;
  local_d8.executor_.super_any_executor_base.object_fns_ =
       (object_fns *)
       asio::execution::detail::any_executor_base::
       object_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>(std::enable_if<(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value)&&(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,std::shared_ptr<void>>::value),void>::type*)
       ::fns;
  local_d8.executor_.super_any_executor_base.object_._12_4_ = 0;
  local_d8.executor_.prop_fns_ =
       (prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)asio::execution::
          any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
          ::prop_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>()::fns;
  local_d8.implementation_.super_base_implementation_type.socket_ = -1;
  local_d8.implementation_.super_base_implementation_type.state_ = '\0';
  local_d8.executor_.super_any_executor_base.object_.__align =
       (anon_struct_8_0_00000001_for___align)&local_118;
  asio::
  connect<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>,asio::ip::basic_resolver_results<asio::ip::tcp>>
            ((endpoint *)&local_188,(asio *)&local_d8,
             (basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_f0,(basic_resolver_results<asio::ip::tcp> *)0x0,ptVar7);
  local_88._M_value = 0;
  local_88._M_cat = (error_category *)std::_V2::system_category();
  local_188._0_8_ = &local_f4;
  local_f4 = akv.key;
  local_188.base.sa_data[6] = '\x04';
  local_188.base.sa_data[7] = '\0';
  local_188.base.sa_data[8] = '\0';
  local_188.base.sa_data[9] = '\0';
  local_188.base.sa_data[10] = '\0';
  local_188.base.sa_data[0xb] = '\0';
  local_188.base.sa_data[0xc] = '\0';
  local_188.base.sa_data[0xd] = '\0';
  local_150._0_8_ = (endpoint *)&local_188;
  asio::detail::
  write_buffer_sequence<asio::basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t>
            (&local_d8,(endpoint *)&local_188,local_150,&local_88);
  asio::detail::socket_ops::sync_recv1
            (local_d8.implementation_.super_base_implementation_type.socket_,
             local_d8.implementation_.super_base_implementation_type.state_,&local_130,0x12,0,
             &local_88);
  local_108 = CONCAT26(uStack_12a,local_130);
  server.IPAddress._M_elems[2] = (undefined1)uStack_128;
  server.IPAddress._M_elems[3] = uStack_128._1_1_;
  server.port = uStack_128._2_2_;
  server.IPAddress._M_elems[0] = (undefined1)uStack_12a;
  server.IPAddress._M_elems[1] = uStack_12a._1_1_;
  DVar10 = Server_Request(local_130,akv);
  action.value = DVar10.value;
  local_100 = DVar10._0_8_;
  DVar10 = Server_Request(server,akv);
  local_164 = DVar10.value;
  local_158 = DVar10._0_8_;
  DVar10 = Server_Request(SUB86(local_124,0),akv);
  uVar8 = local_100;
  local_168 = DVar10.value;
  uVar3 = DVar10._0_8_;
  uVar5 = 0xffffffff00000000;
  if (((((int)local_100 == (int)local_158) && ((local_158 ^ local_100) >> 0x20 == 0)) &&
      (action.value == local_164)) &&
     (((local_160._0_4_ = DVar10.action, (int)local_100 == (int)local_160 &&
       ((uVar3 ^ local_100) >> 0x20 == 0)) &&
      (local_100 < 0xffffffff00000000 && action.value == local_168)))) {
    uVar5 = local_100 & 0xffffffff00000000;
    uVar8 = local_100 & 0xffffffff;
  }
  else {
    local_160 = uVar3;
    if (local_100 < 0xffffffff00000000) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nSERVER RESPONSES DO NOT MATCH:",0x1f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"primaryServer: ",0xf);
      addressInfo_tostr_abi_cxx11_((string *)&local_188,SUB86(local_108,0));
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_188._0_8_,(long)local_188.v4.sin_zero)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  --  ",6);
      uVar3 = local_100;
      local_100._0_4_ = (undefined4)uVar8;
      local_100._4_4_ = SUB84(uVar8,4);
      action.action = (undefined4)local_100;
      action.key = local_100._4_4_;
      local_100 = uVar3;
      dht_action_tostr_abi_cxx11_((string *)local_150,action);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)local_150._0_8_,local_150._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      peVar1 = (endpoint *)(local_150 + 0x10);
      if ((endpoint *)local_150._0_8_ != peVar1) {
        operator_delete((void *)local_150._0_8_);
      }
      if ((int *)local_188._0_8_ != (int *)((long)&local_188 + 0x10U)) {
        operator_delete((void *)local_188._0_8_);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"neighborServer1: ",0x11);
      addressInfo_tostr_abi_cxx11_((string *)&local_188,server);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_188._0_8_,(long)local_188.v4.sin_zero)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  --  ",6);
      action_00.value = local_164;
      action_00.action = (int)local_158;
      action_00.key = local_158._4_4_;
      dht_action_tostr_abi_cxx11_((string *)local_150,action_00);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)local_150._0_8_,local_150._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((endpoint *)local_150._0_8_ != peVar1) {
        operator_delete((void *)local_150._0_8_);
      }
      if ((int *)local_188._0_8_ != (int *)((long)&local_188 + 0x10U)) {
        operator_delete((void *)local_188._0_8_);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"neighborServer2: ",0x11);
      addressInfo_tostr_abi_cxx11_((string *)&local_188,SUB86(local_124,0));
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_188._0_8_,(long)local_188.v4.sin_zero)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  --  ",6);
      action_01.value = local_168;
      action_01.action = (int)local_160;
      action_01.key = local_160._4_4_;
      dht_action_tostr_abi_cxx11_((string *)local_150,action_01);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)local_150._0_8_,local_150._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((endpoint *)local_150._0_8_ != peVar1) {
        operator_delete((void *)local_150._0_8_);
      }
      if ((int *)local_188._0_8_ != (int *)((long)&local_188 + 0x10U)) {
        operator_delete((void *)local_188._0_8_);
      }
      DVar10.value = local_168;
      DVar10.action = (int)local_160;
      DVar10.key = local_160._4_4_;
      uVar8 = 0xffffffff;
      action.value = -1;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nNO SERVERS ACTIVE IN THE DHT\n",0x1e);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      DVar10.value = local_168;
      DVar10.action = (int)local_160;
      DVar10.key = local_160._4_4_;
      action.value = -1;
      uVar8 = 0xffffffff;
    }
  }
  local_168 = DVar10.value;
  local_160 = DVar10._0_8_;
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&local_d8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
  }
  asio::detail::
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&local_78);
  psVar6 = (local_118.super_execution_context.service_registry_)->first_service_;
  eVar9.service_registry_ = local_118.super_execution_context.service_registry_;
  if (psVar6 != (service *)0x0) {
    do {
      (*psVar6->_vptr_service[2])(psVar6);
      eVar9.service_registry_ = local_118.super_execution_context.service_registry_;
      psVar6 = psVar6->next_;
    } while (psVar6 != (service *)0x0);
    psVar6 = (local_118.super_execution_context.service_registry_)->first_service_;
    if (psVar6 != (service *)0x0) {
      do {
        ppp_Var2 = &psVar6->_vptr_service;
        psVar6 = psVar6->next_;
        (*(*ppp_Var2)[1])();
        (eVar9.service_registry_)->first_service_ = psVar6;
      } while (psVar6 != (service *)0x0);
      eVar9.service_registry_ = local_118.super_execution_context.service_registry_;
      if (local_118.super_execution_context.service_registry_ == (service_registry *)0x0) {
        eVar9.service_registry_ = (service_registry *)0x0;
        goto LAB_0011a73f;
      }
    }
  }
  pthread_mutex_destroy((pthread_mutex_t *)&(eVar9.service_registry_)->mutex_);
LAB_0011a73f:
  operator_delete(eVar9.service_registry_);
  DVar11.value = action.value;
  DVar11.action = (int)(uVar5 | uVar8);
  DVar11.key = (int)((uVar5 | uVar8) >> 0x20);
  return DVar11;
}

Assistant:

DHT_action DHT_Request(DHT_action akv) {
	addressInfo trackerServerInfo = { .IPAddress = {127, 0, 0, 1}, .port = 3000 };
	// std::cout << "SERVER: " << addressInfo_tostr(trackerServerInfo) << ", " << dht_action_tostr(akv) << std::endl;
	using asio::ip::tcp;

	asio::io_context io_context;
	tcp::resolver resolver(io_context);
	tcp::resolver::results_type endpoints = resolver.resolve(ip_tostr(trackerServerInfo.IPAddress), std::to_string(trackerServerInfo.port));

	tcp::socket socket(io_context);
	asio::connect(socket, endpoints);

	asio::error_code error;
	std::array<uint8_t, 4> key_message; // we're just sending the key to the tracker
	memcpy(&key_message, &akv.key, sizeof(int));

	asio::write(socket, asio::buffer(key_message), error);
	std::array<uint8_t, 3*sizeof(addressInfo)> return_tracker_message; // we're receiving an array of 3 addressInfo structs
	size_t len = socket.read_some(asio::buffer(return_tracker_message), error);
	std::array<addressInfo, 3> response;
	memcpy(&response, &return_tracker_message, 3*sizeof(addressInfo));
	addressInfo server = response[0];
	addressInfo neighbor1 = response[1];
	addressInfo neighbor2 = response[2];
	
	// NOW THAT WE HAVE THE PORT, CONNECT TO SERVER
	DHT_action primaryServer = Server_Request(server, akv);
	DHT_action neighborServer1 = Server_Request(neighbor1, akv);
	DHT_action neighborServer2 = Server_Request(neighbor2, akv);
	
	if (primaryServer == neighborServer1  && primaryServer == neighborServer2 && primaryServer.key != -1) {
		return primaryServer;
	}
	else if (primaryServer.key == -1) {
		std::cout << "\nNO SERVERS ACTIVE IN THE DHT\n" << std::endl;
		return (DHT_action){.action = -1, .key = -1, .value = -1};
	}
	else {
		std::cout << "\nSERVER RESPONSES DO NOT MATCH:" << std::endl;
		std::cout << "primaryServer: " << addressInfo_tostr(server) << "  --  " << dht_action_tostr(primaryServer) << std::endl;
		std::cout << "neighborServer1: " << addressInfo_tostr(neighbor1) << "  --  " << dht_action_tostr(neighborServer1) << std::endl;
		std::cout << "neighborServer2: " << addressInfo_tostr(neighbor2) << "  --  " << dht_action_tostr(neighborServer2) << std::endl;
		return (DHT_action){.action = -1, .key = -1, .value = -1};
	}
}